

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gecko.cpp
# Opt level: O3

void __thiscall MyProgress::beginorder(MyProgress *this,Graph *param_1,Float cost)

{
  long lVar1;
  ostream *poVar2;
  char *local_30;
  long local_28;
  char local_20 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"f = ",4);
  lVar1 = std::cerr;
  *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) =
       *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(fwrite + *(long *)(lVar1 + -0x18)) = 6;
  poVar2 = std::ostream::_M_insert<double>((double)cost);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," { ",3);
  now_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return;
}

Assistant:

void beginorder(const Graph*, Float cost) const
  {
    std::cerr << "f = " << std::fixed << std::setprecision(6) << cost << " { " << now();
  }